

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

void ComputeConfigCRC(void)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint uVar3;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  uint bnum;
  long lVar9;
  uchar local_88 [8];
  uint local_80;
  undefined4 local_7c;
  uchar local_78 [28];
  undefined4 uStack_5c;
  undefined4 local_58;
  uchar local_48 [12];
  undefined4 uStack_3c;
  undefined4 local_38;
  
  builtin_memcpy(local_88,"1394",5);
  local_88[5] = 0xff;
  local_88[6] = 0xa0;
  local_88[7] = '\0';
  local_7c = 0x7000000;
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  for (uVar8 = 0xe; uVar8 != 0x10; uVar8 = uVar8 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"    // Version: ");
    pcVar7 = "Firewire";
    if (uVar8 == 0xe) {
      pcVar7 = "Ethernet";
    }
    poVar4 = std::operator<<(poVar4,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"    always @(*)");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"    begin");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"        case (board_id)");
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar6 = uVar8 & 0xffffffff;
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      uVar5 = (uint)uVar6;
      uVar3 = uVar5 | 0xfa610e00;
      local_80 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar5 << 0x18;
      uVar1 = ComputeCRC16(local_88,0x10);
      poVar4 = std::operator<<((ostream *)&std::cout,"            4\'h");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,": info_crc = 16\'h");
      *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 4;
      poVar4 = std::operator<<(poVar4,0x30);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
      poVar4 = std::operator<<(poVar4,";");
      std::endl<char,std::char_traits<char>>(poVar4);
      uVar6 = (ulong)(uVar5 + 0x10);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"        endcase");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"    end");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  local_48[0] = '\f';
  local_48[1] = '\0';
  local_48[2] = 0x83;
  local_48[3] = 0xc0;
  local_48[4] = '\x03';
  local_48[5] = 0xfa;
  local_48[6] = 'a';
  local_48[7] = '\x0e';
  stack0xffffffffffffffc0 = 0x100001703000081;
  local_38 = 0x6000081;
  uVar1 = ComputeCRC16(local_48,0x14);
  stack0xffffffffffffffc0 = CONCAT44(0x2000017,local_48._8_4_);
  uVar2 = ComputeCRC16(local_48,0x14);
  poVar4 = std::operator<<((ostream *)&std::cout,"    Root Directory CRC (Rev 1,2): ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 4;
  poVar4 = std::operator<<(poVar4,0x30);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = 'J';
  local_78[9] = 'H';
  local_78[10] = 'U';
  local_78[0xb] = ' ';
  local_78[0xc] = 'L';
  local_78[0xd] = 'C';
  local_78[0xe] = 'S';
  local_78[0xf] = 'R';
  uVar1 = ComputeCRC16(local_78,0x10);
  poVar4 = std::operator<<((ostream *)&std::cout,"    Vendor Descriptor CRC: ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 4;
  poVar4 = std::operator<<(poVar4,0x30);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  stack0xffffffffffffffa0 = 0x4c512f3141475046;
  local_58 = 0x41;
  uVar1 = ComputeCRC16(local_78 + 0x10,0x14);
  stack0xffffffffffffffa0 = CONCAT44(0x4c512f32,local_78._24_4_);
  uVar2 = ComputeCRC16(local_78 + 0x10,0x14);
  poVar4 = std::operator<<((ostream *)&std::cout,"    Model Descriptor CRC (Rev 1,2): ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 4;
  poVar4 = std::operator<<(poVar4,0x30);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2);
  std::endl<char,std::char_traits<char>>(poVar4);
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  return;
}

Assistant:

void ComputeConfigCRC()
{
    uint16_t crc16, crc16Eth;
    quadlet_t bus_info[4];
    bus_info[0] = bswap_32(0x31333934);  // "1394"
    bus_info[1] = bswap_32(0x00ffa000);
    bus_info[2] = bswap_32(0xfa610e00);  // LCSR CID + BID + E/F
    bus_info[3] = bswap_32(0x00000007);  // Firmware version
    std::cout << std::hex;
    for (unsigned int bver = 0x0e; bver <= 0x0f; bver++) {
        std::cout << "    // Version: " << ((bver == 0x0e) ? "Ethernet" : "Firewire") << std::endl;
        std::cout << "    always @(*)" << std::endl;
        std::cout << "    begin" << std::endl;
        std::cout << "        case (board_id)" << std::endl;
        for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++) {
            bus_info[2] = bswap_32(0xfa610e00|(bnum << 4)|bver);
            crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(bus_info), sizeof(bus_info));
            std::cout << "            4'h" << bnum << ": info_crc = 16'h"
                      << std::setw(4) << std::setfill('0') << crc16 << ";" << std::endl;
        }
        std::cout << "        endcase" << std::endl;
        std::cout << "    end" << std::endl;
    }
    quadlet_t root_dir[5];
    root_dir[0] = bswap_32(0x0c0083c0);
    root_dir[1] = bswap_32(0x03fa610e);
    root_dir[2] = bswap_32(0x81000003);
    root_dir[3] = bswap_32(0x17000001);
    root_dir[4] = bswap_32(0x81000006);
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(root_dir), sizeof(root_dir));
    root_dir[3] = bswap_32(0x17000002);
    crc16Eth = ComputeCRC16(reinterpret_cast<unsigned char *>(root_dir), sizeof(root_dir));
    std::cout << "    Root Directory CRC (Rev 1,2): " << std::setw(4) << std::setfill('0') << crc16
              << ", " << crc16Eth << std::endl;
    quadlet_t vendor_desc[4];
    vendor_desc[0] = bswap_32(0x00000000);
    vendor_desc[1] = bswap_32(0x00000000);
    vendor_desc[2] = bswap_32(0x4A485520);  // "JHU "
    vendor_desc[3] = bswap_32(0x4C435352);  // "LCSR"
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(vendor_desc), sizeof(vendor_desc));
    std::cout << "    Vendor Descriptor CRC: " << std::setw(4) << std::setfill('0') << crc16
              << std::endl;
    quadlet_t model_desc[5];
    model_desc[0] = bswap_32(0x00000000);
    model_desc[1] = bswap_32(0x00000000);
    model_desc[2] = bswap_32(0x46504741);   // "FPGA"
    model_desc[3] = bswap_32(0x312F514C);   // "1/QL"
    model_desc[4] = bswap_32(0x41000000);   // "A"
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(model_desc), sizeof(model_desc));
    model_desc[3] = bswap_32(0x322F514C);   // "2/QL"
    crc16Eth = ComputeCRC16(reinterpret_cast<unsigned char *>(model_desc), sizeof(model_desc));
    std::cout << "    Model Descriptor CRC (Rev 1,2): " << std::setw(4) << std::setfill('0') << crc16
              << ", " << crc16Eth << std::endl;
    std::cout << std::dec;
}